

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

char * ma_copy_string(char *src,ma_allocation_callbacks *pAllocationCallbacks)

{
  size_t sVar1;
  char *dst;
  
  if (src != (char *)0x0) {
    sVar1 = strlen(src);
    dst = (char *)ma_malloc(sVar1 + 1,pAllocationCallbacks);
    if (dst != (char *)0x0) {
      ma_strcpy_s(dst,sVar1 + 1,src);
      return dst;
    }
  }
  return (char *)0x0;
}

Assistant:

MA_API MA_NO_INLINE char* ma_copy_string(const char* src, const ma_allocation_callbacks* pAllocationCallbacks)
{
    size_t sz;
    char* dst;

    if (src == NULL) {
        return NULL;
    }

    sz = strlen(src)+1;
    dst = (char*)ma_malloc(sz, pAllocationCallbacks);
    if (dst == NULL) {
        return NULL;
    }

    ma_strcpy_s(dst, sz, src);

    return dst;
}